

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
RepeatedPtrField(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *this,RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *other)

{
  Rep *pRVar1;
  undefined8 *puVar2;
  Rep *pRVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  void **our_elems;
  long lVar7;
  int iVar8;
  
  (this->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
  (this->super_RepeatedPtrFieldBase).current_size_ = 0;
  (this->super_RepeatedPtrFieldBase).total_size_ = 0;
  (this->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
  if ((other->super_RepeatedPtrFieldBase).arena_ == (Arena *)0x0) {
    iVar4 = (this->super_RepeatedPtrFieldBase).current_size_;
    iVar5 = (this->super_RepeatedPtrFieldBase).total_size_;
    pRVar1 = (this->super_RepeatedPtrFieldBase).rep_;
    iVar8 = (other->super_RepeatedPtrFieldBase).total_size_;
    pRVar3 = (other->super_RepeatedPtrFieldBase).rep_;
    (this->super_RepeatedPtrFieldBase).current_size_ =
         (other->super_RepeatedPtrFieldBase).current_size_;
    (this->super_RepeatedPtrFieldBase).total_size_ = iVar8;
    (this->super_RepeatedPtrFieldBase).rep_ = pRVar3;
    (other->super_RepeatedPtrFieldBase).current_size_ = iVar4;
    (other->super_RepeatedPtrFieldBase).total_size_ = iVar5;
    (other->super_RepeatedPtrFieldBase).rep_ = pRVar1;
  }
  else if (other != this) {
    lVar6 = (long)(this->super_RepeatedPtrFieldBase).current_size_;
    if (0 < lVar6) {
      pRVar1 = (this->super_RepeatedPtrFieldBase).rep_;
      lVar7 = 0;
      do {
        puVar2 = (undefined8 *)pRVar1->elements[lVar7];
        lVar7 = lVar7 + 1;
        puVar2[1] = 0;
        *(undefined1 *)*puVar2 = 0;
      } while (lVar6 != lVar7);
      (this->super_RepeatedPtrFieldBase).current_size_ = 0;
    }
    iVar8 = (other->super_RepeatedPtrFieldBase).current_size_;
    if (iVar8 != 0) {
      pRVar1 = (other->super_RepeatedPtrFieldBase).rep_;
      our_elems = internal::RepeatedPtrFieldBase::InternalExtend
                            (&this->super_RepeatedPtrFieldBase,iVar8);
      internal::RepeatedPtrFieldBase::
      MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                (&this->super_RepeatedPtrFieldBase,our_elems,pRVar1->elements,iVar8,
                 ((this->super_RepeatedPtrFieldBase).rep_)->allocated_size -
                 (this->super_RepeatedPtrFieldBase).current_size_);
      iVar8 = iVar8 + (this->super_RepeatedPtrFieldBase).current_size_;
      (this->super_RepeatedPtrFieldBase).current_size_ = iVar8;
      pRVar1 = (this->super_RepeatedPtrFieldBase).rep_;
      if (pRVar1->allocated_size < iVar8) {
        pRVar1->allocated_size = iVar8;
      }
    }
  }
  return;
}

Assistant:

inline RepeatedPtrField<Element>::RepeatedPtrField(
    RepeatedPtrField&& other) noexcept
    : RepeatedPtrField() {
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // other is on an arena. This field can't be on an arena because arena
  // construction always uses the Arena* accepting constructor.
  if (other.GetArena()) {
    CopyFrom(other);
  } else {
    InternalSwap(&other);
  }
}